

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Op soul::StructuralParser::getOpForTypeMetaFunctionName(QualifiedIdentifier *qi)

{
  size_t sVar1;
  Op OVar2;
  Identifier in_stack_ffffffffffffff78;
  IdentifierPath local_80;
  
  IdentifierPath::operator+
            (&local_80,&qi->pathPrefix,
             &((qi->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  sVar1 = local_80.pathSections.numActive;
  local_80.pathSections.numActive = 0;
  if (8 < local_80.pathSections.numAllocated) {
    if (local_80.pathSections.items != (Identifier *)0x0) {
      operator_delete__(local_80.pathSections.items);
    }
    local_80.pathSections.items = (Identifier *)local_80.pathSections.space;
    local_80.pathSections.numAllocated = 8;
  }
  OVar2 = none;
  if (sVar1 == 1) {
    IdentifierPath::operator+
              (&local_80,&qi->pathPrefix,
               &((qi->pathSections).
                 super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                 ._M_impl.super__Vector_impl_data._M_start)->path);
    if (local_80.pathSections.numActive == 0) {
      throwInternalCompilerError("! empty()","front",0xa8);
    }
    OVar2 = AST::TypeMetaFunction::getOperationForName(in_stack_ffffffffffffff78);
    local_80.pathSections.numActive = 0;
    if ((8 < local_80.pathSections.numAllocated) &&
       (local_80.pathSections.items != (Identifier *)0x0)) {
      operator_delete__(local_80.pathSections.items);
    }
  }
  return OVar2;
}

Assistant:

static AST::TypeMetaFunction::Op getOpForTypeMetaFunctionName (const AST::QualifiedIdentifier& qi)
    {
        if (qi.getPath().isUnqualified())
            return AST::TypeMetaFunction::getOperationForName (qi.getPath().getFirstPart());

        return AST::TypeMetaFunction::Op::none;
    }